

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::schema::Node::Builder::initAnnotation(Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<6u>();
  capnp::_::StructBuilder::setDataField<capnp::schema::Node::Which>
            (&this->_builder,uVar1,ANNOTATION);
  uVar1 = bounded<112u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<113u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<114u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<115u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<116u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<117u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<118u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<119u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<120u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<121u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<122u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<123u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<3u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  capnp::_::PointerBuilder::clear(&local_28);
  memcpy(&local_50,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_48;
  base.segment = (SegmentBuilder *)local_50;
  base.data = (void *)local_40;
  base.pointers = (WirePointer *)uStack_38;
  base.dataSize = (undefined4)local_30;
  base.pointerCount = local_30._4_2_;
  base._38_2_ = local_30._6_2_;
  Annotation::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename Node::Annotation::Builder Node::Builder::initAnnotation() {
  _builder.setDataField<Node::Which>(
      ::capnp::bounded<6>() * ::capnp::ELEMENTS, Node::ANNOTATION);
  _builder.setDataField<bool>(::capnp::bounded<112>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<113>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<114>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<115>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<116>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<117>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<118>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<119>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<120>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<121>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<122>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<123>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<3>() * ::capnp::POINTERS).clear();
  return typename Node::Annotation::Builder(_builder);
}